

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_external_partition_test.cc
# Opt level: O0

aom_ext_part_status_t
anon_unknown.dwarf_87c1cb::ext_part_delete_model(aom_ext_part_model_t ext_part_model)

{
  bool bVar1;
  void *in_RDI;
  Message *in_stack_00000028;
  AssertHelper *in_stack_00000030;
  AssertionResult gtest_ar;
  ToyModel *toy_model;
  AssertHelper *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  Type in_stack_ffffffffffffffdc;
  AssertHelper *in_stack_ffffffffffffffe0;
  
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int *)in_stack_ffffffffffffffb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffe0);
    testing::AssertionResult::failure_message((AssertionResult *)0x74d985);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    testing::internal::AssertHelper::operator=(in_stack_00000030,in_stack_00000028);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffffb0);
    testing::Message::~Message((Message *)0x74d9d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x74da23);
  if (in_RDI != (void *)0x0) {
    operator_delete(in_RDI);
  }
  return AOM_EXT_PART_OK;
}

Assistant:

aom_ext_part_status_t ext_part_delete_model(
    aom_ext_part_model_t ext_part_model) {
  ToyModel *toy_model = static_cast<ToyModel *>(ext_part_model);
  EXPECT_EQ(toy_model->data->version, kVersion);
  delete toy_model;
  return AOM_EXT_PART_OK;
}